

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O0

double Chi2CDF(double x,int dof)

{
  int in_EDI;
  double in_XMM0_Qa;
  double dVar1;
  double in_stack_000000b0;
  double in_stack_000000b8;
  undefined8 local_8;
  
  if ((in_EDI < 1) || (in_XMM0_Qa < 0.0)) {
    local_8 = 0.0;
  }
  else if (in_EDI == 2) {
    local_8 = exp(in_XMM0_Qa * -0.5);
    local_8 = 1.0 - local_8;
  }
  else {
    dVar1 = RLGamma(in_stack_000000b8,in_stack_000000b0);
    local_8 = (double)(float)dVar1;
  }
  return local_8;
}

Assistant:

double Chi2CDF(double x, int dof) {
    if (dof < 1 || x < 0) {
        return 0.0;
    } else if (dof == 2) {
        return 1.0 - std::exp(-0.5 * x);
    } else {
        return (Float)RLGamma(0.5 * dof, 0.5 * x);
    }
}